

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjasm.cpp
# Opt level: O2

void __thiscall Options::COptionsParser::parseSyntaxValue(COptionsParser *this)

{
  char cVar1;
  ulong uVar2;
  ulong in_RAX;
  char *badValueMessage;
  char *message;
  long lVar3;
  undefined4 uStack_38;
  char this_option_is [2];
  char this_option_is_1 [2];
  
  lVar3 = 0;
  _uStack_38 = in_RAX;
  do {
    uVar2 = _uStack_38;
    if (lVar3 == 0x800) {
      return;
    }
    cVar1 = this->val[lVar3];
    switch(cVar1) {
    case 'a':
      DAT_0018a520 = doubleComma;
      break;
    case 'b':
      DAT_0018a518 = 1;
      break;
    case 'c':
    case 'd':
    case 'e':
    case 'g':
    case 'h':
    case 'j':
    case 'k':
switchD_00124b32_caseD_63:
      this_option_is_1 = SUB82(uVar2,6);
      _uStack_38 = (uint6)CONCAT14(cVar1,uStack_38);
      message = "Unrecognized syntax option";
      badValueMessage = this_option_is;
      goto LAB_00124b6a;
    case 'f':
      _DAT_0018a50a = 0x101;
      break;
    case 'i':
      DAT_0018a514 = 1;
      break;
    case 'l':
switchD_00124b32_caseD_6c:
      _uStack_38 = (ulong)CONCAT16(cVar1,_uStack_38);
      message = "Syntax option not implemented yet";
      badValueMessage = this_option_is_1;
LAB_00124b6a:
      Error(message,badValueMessage,PASS03);
      break;
    default:
      if (cVar1 == 'B') {
        DAT_0018a518 = 2;
      }
      else if (cVar1 == 'F') {
        _DAT_0018a50a = _DAT_0018a50a & 0xff00;
      }
      else {
        if (cVar1 == 'L') goto switchD_00124b32_caseD_6c;
        if (cVar1 == 'M') {
          DAT_0018a516 = 1;
        }
        else if (cVar1 == 's') {
          DAT_0018a517 = 0;
        }
        else {
          if (cVar1 != 'w') {
            if (cVar1 == '\0') {
              return;
            }
            goto switchD_00124b32_caseD_63;
          }
          DAT_0018a515 = 1;
        }
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

void parseSyntaxValue() {
			// Options::syx is expected to be already in default state before entering this
			for (const auto & syntaxOption : val) {
				switch (syntaxOption) {
				case 0:   return;
				// f F - instructions: fake warning, no fakes (default = fake enabled)
				case 'f': syx.FakeEnabled = syx.FakeWarning = true; break;
				case 'F': syx.FakeEnabled = false; break;
				// a - multi-argument delimiter ",," (default is ",")
				case 'a': syx.MultiArg = &doubleComma; break;
				// b - single parentheses enforce mem access (default = relaxed syntax)
				case 'b': syx.MemoryBrackets = 1; break;
				// B - memory access brackets [] required (default = relaxed syntax)
				case 'B': syx.MemoryBrackets = 2; break;
				// l L - warn/error about labels using keywords (default = no message)
				case 'l':
				case 'L':
				{
					const char this_option_is[2] = { syntaxOption, 0 };
					Error("Syntax option not implemented yet", this_option_is, PASS03);
					break;
				}
				// i - case insensitive instructions/directives (default = same case required)
				case 'i': syx.CaseInsensitiveInstructions = true; break;
				// w - warnings option: report warnings as errors
				case 'w': syx.WarningsAsErrors = true; break;
				// M - alias "m" and "M" for "(hl)" to cover 8080-like syntax: ADD A,M
				case 'M': syx.Is_M_Memory = true; break;
				// s - switch off sub-word substitution in DEFINEs (s like "Simple defines" or "Sub word")
				case 's': syx.IsSubwordSubstitution = false; break;
				// unrecognized option
				default:
					const char this_option_is[2] = { syntaxOption, 0 };
					Error("Unrecognized syntax option", this_option_is, PASS03);
					break;
				}
			}
		}